

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O0

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,int>
               (AVisitor<hiberlite::KillChildren> *ar,vector<int,_std::allocator<int>_> *v,
               uint param_3)

{
  stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_> _s;
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_e0;
  stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_> local_a8;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  body;
  uint param_2_local;
  vector<int,_std::allocator<int>_> *v_local;
  AVisitor<hiberlite::KillChildren> *ar_local;
  
  body.stream._20_4_ = param_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"items",&local_79);
  stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>::stl_stream_adapter(&local_a8,v);
  _s.it._M_current = local_a8.it._M_current;
  _s.ct = local_a8.ct;
  _s.xx = local_a8.xx;
  _s._20_4_ = local_a8._20_4_;
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::collection_nvp((collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
                    *)local_58,(string *)local_78,_s);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::collection_nvp(&local_e0,
                   (collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
                    *)local_58);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_e0);
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::~collection_nvp(&local_e0);
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::~collection_nvp((collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
                     *)local_58);
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}